

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

void __thiscall pbrt::CameraSceneEntity::~CameraSceneEntity(CameraSceneEntity *this)

{
  std::__cxx11::string::~string((string *)&this->medium);
  SceneEntity::~SceneEntity(&this->super_SceneEntity);
  return;
}

Assistant:

CameraSceneEntity(const std::string &name, ParameterDictionary parameters,
                      FileLoc loc, const CameraTransform &cameraTransform,
                      const std::string &medium)
        : SceneEntity(name, parameters, loc),
          cameraTransform(cameraTransform),
          medium(medium) {}